

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.hpp
# Opt level: O2

void __thiscall
OpenMD::TruncatedCube::TruncatedCube(TruncatedCube *this,string *lattice,int cells,int planes)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)lattice);
  Cuboctahedron::Cuboctahedron(&this->super_Cuboctahedron,&local_40,cells,planes);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Cuboctahedron)._vptr_Cuboctahedron = (_func_int **)&PTR__Cuboctahedron_00203b90;
  return;
}

Assistant:

TruncatedCube(std::string lattice, int cells, int planes) :
        Cuboctahedron(lattice, cells, planes) {}